

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.cpp
# Opt level: O0

void __thiscall
zmq::socks_basic_auth_request_t::socks_basic_auth_request_t
          (socks_basic_auth_request_t *this,string *username_,string *password_)

{
  ulong uVar1;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  uVar1 = std::__cxx11::string::size();
  if (0xff < uVar1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","username_.size () <= UINT8_MAX",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socks.cpp"
            ,0x89);
    fflush(_stderr);
    zmq_abort((char *)0x319dba);
  }
  uVar1 = std::__cxx11::string::size();
  if (0xff < uVar1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","password_.size () <= UINT8_MAX",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socks.cpp"
            ,0x8a);
    fflush(_stderr);
    zmq_abort((char *)0x319e56);
  }
  return;
}

Assistant:

zmq::socks_basic_auth_request_t::socks_basic_auth_request_t (
  const std::string &username_, const std::string &password_) :
    username (username_),
    password (password_)
{
    zmq_assert (username_.size () <= UINT8_MAX);
    zmq_assert (password_.size () <= UINT8_MAX);
}